

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void rapidjson::internal::TokenHelper<rapidjson::internal::Stack<rapidjson::CrtAllocator>,_char>::
     AppendIndexToken(Stack<rapidjson::CrtAllocator> *documentStack,SizeType index)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar1 = Stack<rapidjson::CrtAllocator>::Push<char>(documentStack,0xb);
  *pcVar1 = '/';
  pcVar2 = u32toa(index,pcVar1 + 1);
  lVar3 = (long)(pcVar1 + 1) - (long)pcVar2;
  if (lVar3 + 10U <= (ulong)((long)documentStack->stackTop_ - (long)documentStack->stack_)) {
    documentStack->stackTop_ = documentStack->stackTop_ + (-10 - lVar3);
    return;
  }
  __assert_fail("GetSize() >= count * sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x8b,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

RAPIDJSON_FORCEINLINE static void AppendIndexToken(Stack& documentStack, SizeType index) {
        RAPIDJSON_IF_CONSTEXPR (sizeof(SizeType) == 4) {
            char *buffer = documentStack.template Push<char>(1 + 10); // '/' + uint
            *buffer++ = '/';
            const char* end = internal::u32toa(index, buffer);
             documentStack.template Pop<char>(static_cast<size_t>(10 - (end - buffer)));
        }
        else {
            char *buffer = documentStack.template Push<char>(1 + 20); // '/' + uint64
            *buffer++ = '/';
            const char* end = internal::u64toa(index, buffer);
            documentStack.template Pop<char>(static_cast<size_t>(20 - (end - buffer)));
        }